

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm)

{
  bool bVar1;
  HandlerResponse HVar2;
  ContentReader local_210;
  ContentReader local_1d0;
  ContentReader local_190;
  int local_14c;
  ContentReader local_148;
  anon_class_32_4_58ec1421 local_f8;
  MultipartReader local_d8;
  anon_class_32_4_58ec1421 local_b8;
  Reader local_98;
  undefined1 local_78 [8];
  ContentReader reader;
  bool is_head_request;
  Stream *strm_local;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)&this->pre_routing_handler_);
  if ((bVar1) &&
     (HVar2 = std::
              function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
              ::operator()(&this->pre_routing_handler_,req,res), HVar2 == Handled)) {
    this_local._7_1_ = 1;
    goto LAB_001d489a;
  }
  reader.multipart_reader_._M_invoker._7_1_ = std::operator==(&req->method,"HEAD");
  bVar1 = std::operator==(&req->method,"GET");
  if (((bVar1) || ((reader.multipart_reader_._M_invoker._7_1_ & 1) != 0)) &&
     (bVar1 = handle_file_request(this,req,res,(bool)(reader.multipart_reader_._M_invoker._7_1_ & 1)
                                 ), bVar1)) {
    this_local._7_1_ = 1;
    goto LAB_001d489a;
  }
  bVar1 = detail::expect_content(req);
  if (bVar1) {
    local_b8.this = this;
    local_b8.strm = strm;
    local_b8.req = req;
    local_b8.res = res;
    std::function<bool(std::function<bool(char_const*,unsigned_long)>)>::
    function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&)::_lambda(std::function<bool(char_const*,unsigned_long)>)_1_,void>
              ((function<bool(std::function<bool(char_const*,unsigned_long)>)> *)&local_98,&local_b8
              );
    local_f8.this = this;
    local_f8.strm = strm;
    local_f8.req = req;
    local_f8.res = res;
    std::
    function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
    ::
    function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&)::_lambda(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)_1_,void>
              ((function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
                *)&local_d8,&local_f8);
    ContentReader::ContentReader((ContentReader *)local_78,&local_98,&local_d8);
    std::
    function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
    ::~function(&local_d8);
    std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::~function(&local_98);
    bVar1 = std::operator==(&req->method,"POST");
    if (bVar1) {
      ContentReader::ContentReader(&local_148,(ContentReader *)local_78);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_148,&this->post_handlers_for_content_reader_);
      ContentReader::~ContentReader(&local_148);
      if (!bVar1) goto LAB_001d46a6;
      this_local._7_1_ = 1;
      local_14c = 1;
    }
    else {
      bVar1 = std::operator==(&req->method,"PUT");
      if (bVar1) {
        ContentReader::ContentReader(&local_190,(ContentReader *)local_78);
        bVar1 = dispatch_request_for_content_reader
                          (this,req,res,&local_190,&this->put_handlers_for_content_reader_);
        ContentReader::~ContentReader(&local_190);
        if (bVar1) {
          this_local._7_1_ = 1;
          local_14c = 1;
          goto LAB_001d46b0;
        }
      }
      else {
        bVar1 = std::operator==(&req->method,"PATCH");
        if (bVar1) {
          ContentReader::ContentReader(&local_1d0,(ContentReader *)local_78);
          bVar1 = dispatch_request_for_content_reader
                            (this,req,res,&local_1d0,&this->patch_handlers_for_content_reader_);
          ContentReader::~ContentReader(&local_1d0);
          if (bVar1) {
            this_local._7_1_ = 1;
            local_14c = 1;
            goto LAB_001d46b0;
          }
        }
        else {
          bVar1 = std::operator==(&req->method,"DELETE");
          if (bVar1) {
            ContentReader::ContentReader(&local_210,(ContentReader *)local_78);
            bVar1 = dispatch_request_for_content_reader
                              (this,req,res,&local_210,&this->delete_handlers_for_content_reader_);
            ContentReader::~ContentReader(&local_210);
            if (bVar1) {
              this_local._7_1_ = 1;
              local_14c = 1;
              goto LAB_001d46b0;
            }
          }
        }
      }
LAB_001d46a6:
      local_14c = 0;
    }
LAB_001d46b0:
    ContentReader::~ContentReader((ContentReader *)local_78);
    if (local_14c != 0) goto LAB_001d489a;
    bVar1 = read_content(this,strm,req,res);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_001d489a;
    }
  }
  bVar1 = std::operator==(&req->method,"GET");
  if ((bVar1) || (bVar1 = std::operator==(&req->method,"HEAD"), bVar1)) {
    this_local._7_1_ = dispatch_request(this,req,res,&this->get_handlers_);
  }
  else {
    bVar1 = std::operator==(&req->method,"POST");
    if (bVar1) {
      this_local._7_1_ = dispatch_request(this,req,res,&this->post_handlers_);
    }
    else {
      bVar1 = std::operator==(&req->method,"PUT");
      if (bVar1) {
        this_local._7_1_ = dispatch_request(this,req,res,&this->put_handlers_);
      }
      else {
        bVar1 = std::operator==(&req->method,"DELETE");
        if (bVar1) {
          this_local._7_1_ = dispatch_request(this,req,res,&this->delete_handlers_);
        }
        else {
          bVar1 = std::operator==(&req->method,"OPTIONS");
          if (bVar1) {
            this_local._7_1_ = dispatch_request(this,req,res,&this->options_handlers_);
          }
          else {
            bVar1 = std::operator==(&req->method,"PATCH");
            if (bVar1) {
              this_local._7_1_ = dispatch_request(this,req,res,&this->patch_handlers_);
            }
            else {
              res->status = 400;
              this_local._7_1_ = 0;
            }
          }
        }
      }
    }
  }
LAB_001d489a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm) {
  if (pre_routing_handler_ &&
      pre_routing_handler_(req, res) == HandlerResponse::Handled) {
    return true;
  }

  // File handler
  bool is_head_request = req.method == "HEAD";
  if ((req.method == "GET" || is_head_request) &&
      handle_file_request(req, res, is_head_request)) {
    return true;
  }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, req, res, std::move(receiver), nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(strm, req, res, nullptr,
                                                      std::move(header),
                                                      std::move(receiver));
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                patch_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "DELETE") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                delete_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}